

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.h
# Opt level: O2

string_view __thiscall slang::ast::InstanceArraySymbol::getArrayName(InstanceArraySymbol *this)

{
  Scope *pSVar1;
  Symbol *this_00;
  InstanceArraySymbol *this_01;
  string_view sVar2;
  
  pSVar1 = (this->super_Symbol).parentScope;
  if ((pSVar1 != (Scope *)0x0) && (this_00 = pSVar1->thisSym, this_00->kind == InstanceArray)) {
    this_01 = Symbol::as<slang::ast::InstanceArraySymbol>(this_00);
    sVar2 = getArrayName(this_01);
    return sVar2;
  }
  return (this->super_Symbol).name;
}

Assistant:

const Scope* getParentScope() const { return parentScope; }